

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O1

string * __thiscall
testing::(anonymous_namespace)::FormatTimes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int n)

{
  ostream *poVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  iVar3 = (int)this;
  if (iVar3 == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "twice";
    pcVar2 = "";
  }
  else {
    if (iVar3 != 1) {
      std::__cxx11::stringstream::stringstream(asStack_198);
      poVar1 = (ostream *)std::ostream::operator<<(local_188,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," times",6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(asStack_198);
      std::ios_base::~ios_base(local_118);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "once";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}